

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O2

void xray_re::initialize(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  float fVar6;
  
  for (uVar4 = 0x1fff; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
    uVar1 = (uint)(uVar4 >> 7) & 0x1ffffff;
    uVar5 = (uint)uVar4 & 0x7f;
    uVar2 = uVar5 ^ 0x7f;
    uVar3 = 0x7f - uVar1;
    if (uVar1 + uVar5 < 0x7f) {
      uVar2 = uVar5;
      uVar3 = uVar1;
    }
    fVar6 = (126.0 - (float)(int)uVar3) - (float)uVar2;
    *(float *)(uv_adjustment + uVar4 * 4) =
         1.0 / SQRT(fVar6 * fVar6 + (float)(int)(uVar2 * uVar2 + uVar3 * uVar3));
  }
  initialized = 1;
  return;
}

Assistant:

void initialize()
{
//	for (int i = 0; i != xr_dim(uv_adjustment); ++i) {
	for (int i = xr_dim(uv_adjustment); --i >= 0;) {
		int u = i >> 7;
		int v = i & 0x7f;
		if (u + v >= 127) {
			u = 127 - u;
			v = 127 - v;
		}
		uv_adjustment[i] = 1.f/std::sqrt(u*u + v*v + (126.f-u-v)*(126.f-u-v));
	}
	initialized = true;
}